

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_numeric_suite.cpp
# Opt level: O1

void numeric_suite::test_adjacent_difference_back_inserter(void)

{
  basic_iterator<int> first_end;
  uint uVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  vector<int,_std::allocator<int>_> data;
  circular_array<int,_4UL> result;
  allocator_type local_89;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  circular_array<int,_4UL> **local_58;
  ulong uStack_50;
  int local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  circular_array<int,_4UL> *local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_38 = 0x160000000b;
  uStack_30 = 0x2c00000021;
  local_28 = (circular_array<int,_4UL> *)CONCAT44(local_28._4_4_,0x37);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,(allocator_type *)&local_88);
  local_20 = 0;
  local_18 = 4;
  local_28 = (circular_array<int,_4UL> *)&local_38;
  std::
  adjacent_difference<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<vista::circular_array<int,4ul>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,(circular_array<int,_4UL> *)&local_38);
  local_48[0] = 0xb;
  local_48[1] = 0xb;
  local_48[2] = 0xb;
  local_48[3] = 0xb;
  __l_00._M_len = 4;
  __l_00._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,__l_00,&local_89);
  local_58 = &local_28;
  first_begin.current._0_4_ = (uint)local_18 - (int)local_20 & 7;
  uVar1 = (uint)local_18 & 7;
  uStack_50 = (ulong)uVar1;
  first_end.current._0_4_ = uVar1;
  first_end.parent = (view_pointer)local_58;
  first_end.current._4_4_ = 0;
  first_begin.parent = (view_pointer)local_58;
  first_begin.current._4_4_ = 0;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_numeric_suite.cpp"
             ,0x34,"void numeric_suite::test_adjacent_difference_back_inserter()",first_begin,
             first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_adjacent_difference_back_inserter()
{
    std::vector<int> data = {11, 22, 33, 44, 55};
    circular_array<int, 4> result;
    std::adjacent_difference(data.begin(), data.end(), std::back_inserter(result));
    std::vector<int> expect = {22 - 11, 33 - 22, 44 - 33, 55 - 44};
    BOOST_TEST_ALL_EQ(result.begin(), result.end(), expect.begin(), expect.end());
}